

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_kry.c
# Opt level: O3

int jactimes(N_Vector v,N_Vector Jv,N_Vector u,int *new_u,void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  lVar1 = N_VGetArrayPointer();
  lVar2 = N_VGetArrayPointer(Jv);
  lVar3 = 1;
  do {
    lVar4 = 0;
    do {
      dVar5 = 0.0;
      if (lVar3 == 1) {
LAB_0010185b:
        dVar6 = *(double *)(lVar1 + 8 + lVar4);
      }
      else {
        dVar5 = *(double *)(lVar1 + -8 + lVar4);
        dVar6 = 0.0;
        if (lVar3 != 0x1f) goto LAB_0010185b;
      }
      if (lVar4 == 0) {
        dVar7 = 0.0;
LAB_00101882:
        dVar9 = *(double *)(lVar1 + 0xf8 + lVar4);
      }
      else {
        dVar7 = *(double *)(lVar1 + -0xf8 + lVar4);
        dVar9 = 0.0;
        if (lVar4 != 0x1d10) goto LAB_00101882;
      }
      dVar8 = *(double *)(lVar1 + lVar4) + *(double *)(lVar1 + lVar4);
      *(double *)(lVar2 + lVar4) =
           ((dVar7 - dVar8) + dVar9) * 1024.0 + ((dVar6 - dVar8) + dVar5) * 1024.0;
      lVar4 = lVar4 + 0xf8;
    } while (lVar4 != 0x1e08);
    lVar3 = lVar3 + 1;
    lVar1 = lVar1 + 8;
    lVar2 = lVar2 + 8;
    if (lVar3 == 0x20) {
      return 0;
    }
  } while( true );
}

Assistant:

static int jactimes(N_Vector v, N_Vector Jv, N_Vector u, sunbooleantype* new_u,
                    void* user_data)
{
  sunrealtype dx, dy, hdiff, vdiff;
  sunrealtype hdc, vdc;
  sunrealtype vij, vdn, vup, vlt, vrt;
  sunrealtype *vdata, *Jvdata;

  int i, j;

  dx  = ONE / (NX + 1);
  dy  = ONE / (NY + 1);
  hdc = ONE / (dx * dx);
  vdc = ONE / (dy * dy);

  vdata  = N_VGetArrayPointer(v);
  Jvdata = N_VGetArrayPointer(Jv);

  for (j = 1; j <= NY; j++)
  {
    for (i = 1; i <= NX; i++)
    {
      /* Extract v at x_i, y_j and four neighboring points */

      vij = IJth(vdata, i, j);
      vdn = (j == 1) ? ZERO : IJth(vdata, i, j - 1);
      vup = (j == NY) ? ZERO : IJth(vdata, i, j + 1);
      vlt = (i == 1) ? ZERO : IJth(vdata, i - 1, j);
      vrt = (i == NX) ? ZERO : IJth(vdata, i + 1, j);

      /* Evaluate diffusion components */

      hdiff = hdc * (vlt - TWO * vij + vrt);
      vdiff = vdc * (vup - TWO * vij + vdn);

      /* Set Jv at x_i, y_j */

      IJth(Jvdata, i, j) = hdiff + vdiff;
    }
  }

  return (0);
}